

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O0

void trans_store_16x16_lpf_vert14(uchar *in0,int in_p,uchar *out,int out_p,int is_store_avx2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined8 *puVar33;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  __m256i row_s1415;
  __m256i row_s1213;
  __m256i row_s1011;
  __m256i row_s89;
  __m256i row_s67;
  __m256i row_s45;
  __m256i row_s23;
  __m256i row_s01;
  __m256i y_s27;
  __m256i y_s26;
  __m256i y_s25;
  __m256i y_s24;
  __m256i y_s23;
  __m256i y_s22;
  __m256i y_s21;
  __m256i y_s20;
  __m256i y_s17;
  __m256i y_s16;
  __m256i y_s15;
  __m256i y_s14;
  __m256i y_s13;
  __m256i y_s12;
  __m256i y_s11;
  __m256i y_s10;
  __m256i y_s07;
  __m256i y_s06;
  __m256i y_s05;
  __m256i y_s04;
  __m256i y_s03;
  __m256i y_s02;
  __m256i y_s01;
  __m256i y_s00;
  __m256i y7;
  __m256i y6;
  __m256i y5;
  __m256i y4;
  __m256i y3;
  __m256i y2;
  __m256i y1;
  __m256i y0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 *puStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 *puStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 *puStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 *puStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 *puStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 *puStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 *puStack_10c8;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a40;
  undefined8 uStack_a38;
  
  uVar11 = *(undefined8 *)(*in_RDI + (in_ESI << 3));
  uVar12 = *(undefined8 *)((long)(*in_RDI + (in_ESI << 3)) + 8);
  uVar13 = *(undefined8 *)(*in_RDI + in_ESI * 9);
  uVar14 = *(undefined8 *)((long)(*in_RDI + in_ESI * 9) + 8);
  uVar15 = *(undefined8 *)(*in_RDI + in_ESI * 10);
  uVar16 = *(undefined8 *)((long)(*in_RDI + in_ESI * 10) + 8);
  uVar17 = *(undefined8 *)(*in_RDI + in_ESI * 0xb);
  uVar18 = *(undefined8 *)((long)(*in_RDI + in_ESI * 0xb) + 8);
  uVar19 = *(undefined8 *)(*in_RDI + in_ESI * 0xc);
  uVar20 = *(undefined8 *)((long)(*in_RDI + in_ESI * 0xc) + 8);
  uVar21 = *(undefined8 *)(*in_RDI + in_ESI * 0xd);
  uVar22 = *(undefined8 *)((long)(*in_RDI + in_ESI * 0xd) + 8);
  uVar23 = *(undefined8 *)(*in_RDI + in_ESI * 0xe);
  uVar24 = *(undefined8 *)((long)(*in_RDI + in_ESI * 0xe) + 8);
  uVar25 = *(undefined8 *)(*in_RDI + in_ESI * 0xf);
  uVar26 = *(undefined8 *)((long)(*in_RDI + in_ESI * 0xf) + 8);
  auVar5._16_8_ = uVar11;
  auVar5._0_16_ = *in_RDI;
  auVar5._24_8_ = uVar12;
  auVar1._16_8_ = uVar13;
  auVar1._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI);
  auVar1._24_8_ = uVar14;
  auVar5 = vpunpcklbw_avx2(auVar5,auVar1);
  auVar32._16_8_ = uVar11;
  auVar32._0_16_ = *in_RDI;
  auVar32._24_8_ = uVar12;
  auVar31._16_8_ = uVar13;
  auVar31._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI);
  auVar31._24_8_ = uVar14;
  auVar1 = vpunpckhbw_avx2(auVar32,auVar31);
  auVar6._16_8_ = uVar15;
  auVar6._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 2);
  auVar6._24_8_ = uVar16;
  auVar2._16_8_ = uVar17;
  auVar2._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 3);
  auVar2._24_8_ = uVar18;
  auVar6 = vpunpcklbw_avx2(auVar6,auVar2);
  auVar30._16_8_ = uVar15;
  auVar30._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 2);
  auVar30._24_8_ = uVar16;
  auVar29._16_8_ = uVar17;
  auVar29._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 3);
  auVar29._24_8_ = uVar18;
  auVar2 = vpunpckhbw_avx2(auVar30,auVar29);
  auVar7._16_8_ = uVar19;
  auVar7._0_16_ = *(undefined1 (*) [16])(*in_RDI + (in_ESI << 2));
  auVar7._24_8_ = uVar20;
  auVar3._16_8_ = uVar21;
  auVar3._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 5);
  auVar3._24_8_ = uVar22;
  auVar7 = vpunpcklbw_avx2(auVar7,auVar3);
  auVar28._16_8_ = uVar19;
  auVar28._0_16_ = *(undefined1 (*) [16])(*in_RDI + (in_ESI << 2));
  auVar28._24_8_ = uVar20;
  auVar27._16_8_ = uVar21;
  auVar27._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 5);
  auVar27._24_8_ = uVar22;
  auVar3 = vpunpckhbw_avx2(auVar28,auVar27);
  auVar8._16_8_ = uVar23;
  auVar8._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 6);
  auVar8._24_8_ = uVar24;
  auVar4._16_8_ = uVar25;
  auVar4._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 7);
  auVar4._24_8_ = uVar26;
  auVar8 = vpunpcklbw_avx2(auVar8,auVar4);
  auVar10._16_8_ = uVar23;
  auVar10._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 6);
  auVar10._24_8_ = uVar24;
  auVar9._16_8_ = uVar25;
  auVar9._0_16_ = *(undefined1 (*) [16])(*in_RDI + in_ESI * 7);
  auVar9._24_8_ = uVar26;
  auVar4 = vpunpckhbw_avx2(auVar10,auVar9);
  auVar9 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar6 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar10 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar2 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar7 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar3 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar8 = vpunpckldq_avx2(auVar9,auVar10);
  auVar4 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar9 = vpunpckldq_avx2(auVar5,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar5,auVar2);
  auVar10 = vpunpckldq_avx2(auVar6,auVar7);
  auVar5 = vpunpckhdq_avx2(auVar6,auVar7);
  auVar6 = vpunpckldq_avx2(auVar1,auVar3);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar3);
  auVar3 = vpermq_avx2(auVar8,0xd8);
  auVar4 = vpermq_avx2(auVar4,0xd8);
  auVar7 = vpermq_avx2(auVar9,0xd8);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  auVar8 = vpermq_avx2(auVar10,0xd8);
  auVar5 = vpermq_avx2(auVar5,0xd8);
  auVar6 = vpermq_avx2(auVar6,0xd8);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  local_10e0 = auVar3._0_8_;
  uStack_10d8 = auVar3._8_8_;
  puStack_10c8 = auVar3._24_8_;
  uStack_10d0 = auVar3._16_8_;
  local_1100 = auVar4._0_8_;
  uStack_10f8 = auVar4._8_8_;
  puStack_10e8 = auVar4._24_8_;
  uStack_10f0 = auVar4._16_8_;
  local_1120 = auVar7._0_8_;
  uStack_1118 = auVar7._8_8_;
  puStack_1108 = auVar7._24_8_;
  uStack_1110 = auVar7._16_8_;
  local_1140 = auVar2._0_8_;
  uStack_1138 = auVar2._8_8_;
  puStack_1128 = auVar2._24_8_;
  uStack_1130 = auVar2._16_8_;
  local_1160 = auVar8._0_8_;
  uStack_1158 = auVar8._8_8_;
  puStack_1148 = auVar8._24_8_;
  uStack_1150 = auVar8._16_8_;
  local_1180 = auVar5._0_8_;
  uStack_1178 = auVar5._8_8_;
  puStack_1168 = auVar5._24_8_;
  uStack_1170 = auVar5._16_8_;
  local_11a0 = auVar6._0_8_;
  uStack_1198 = auVar6._8_8_;
  puStack_1188 = auVar6._24_8_;
  uStack_1190 = auVar6._16_8_;
  local_11c0 = auVar1._0_8_;
  uStack_11b8 = auVar1._8_8_;
  uStack_11b0 = auVar1._16_8_;
  uStack_11a8 = auVar1._24_8_;
  if (in_R8D == 0) {
    *in_RDX = local_10e0;
    in_RDX[1] = uStack_10d8;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 2));
    *puVar33 = local_1100;
    puVar33[1] = uStack_10f8;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
    *puVar33 = local_1120;
    puVar33[1] = uStack_1118;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
    *puVar33 = local_1140;
    puVar33[1] = uStack_1138;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 3));
    *puVar33 = local_1160;
    puVar33[1] = uStack_1158;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 10));
    *puVar33 = local_1180;
    puVar33[1] = uStack_1178;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xc));
    *puVar33 = local_11a0;
    puVar33[1] = uStack_1198;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xe));
    *puVar33 = local_11c0;
    puVar33[1] = uStack_11b8;
    *puStack_10c8 = local_a40;
    puStack_10c8[1] = uStack_a38;
    *puStack_10e8 = local_a60;
    puStack_10e8[1] = uStack_a58;
    *puStack_1108 = local_a80;
    puStack_1108[1] = uStack_a78;
    *puStack_1128 = local_aa0;
    puStack_1128[1] = uStack_a98;
    *puStack_1148 = local_ac0;
    puStack_1148[1] = uStack_ab8;
    *puStack_1168 = local_ae0;
    puStack_1168[1] = uStack_ad8;
    *puStack_1188 = local_b00;
    puStack_1188[1] = uStack_af8;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xf));
    *puVar33 = uStack_11b0;
    puVar33[1] = uStack_11a8;
  }
  else {
    *in_RDX = local_10e0;
    in_RDX[1] = uStack_10d8;
    in_RDX[2] = uStack_10d0;
    in_RDX[3] = puStack_10c8;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 1));
    *puVar33 = local_1100;
    puVar33[1] = uStack_10f8;
    puVar33[2] = uStack_10f0;
    puVar33[3] = puStack_10e8;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
    *puVar33 = local_1120;
    puVar33[1] = uStack_1118;
    puVar33[2] = uStack_1110;
    puVar33[3] = puStack_1108;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
    *puVar33 = local_1140;
    puVar33[1] = uStack_1138;
    puVar33[2] = uStack_1130;
    puVar33[3] = puStack_1128;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 3));
    *puVar33 = local_1160;
    puVar33[1] = uStack_1158;
    puVar33[2] = uStack_1150;
    puVar33[3] = puStack_1148;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 10));
    *puVar33 = local_1180;
    puVar33[1] = uStack_1178;
    puVar33[2] = uStack_1170;
    puVar33[3] = puStack_1168;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xc));
    *puVar33 = local_11a0;
    puVar33[1] = uStack_1198;
    puVar33[2] = uStack_1190;
    puVar33[3] = puStack_1188;
    puVar33 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xe));
    *puVar33 = local_11c0;
    puVar33[1] = uStack_11b8;
    puVar33[2] = uStack_11b0;
    puVar33[3] = uStack_11a8;
  }
  return;
}

Assistant:

static inline void trans_store_16x16_lpf_vert14(unsigned char *in0, int in_p,
                                                unsigned char *out, int out_p,
                                                int is_store_avx2) {
  const __m128i x0 = _mm_loadu_si128((__m128i *)in0);
  const __m128i x1 = _mm_loadu_si128((__m128i *)(in0 + in_p * 1));
  const __m128i x2 = _mm_loadu_si128((__m128i *)(in0 + in_p * 2));
  const __m128i x3 = _mm_loadu_si128((__m128i *)(in0 + in_p * 3));
  const __m128i x4 = _mm_loadu_si128((__m128i *)(in0 + in_p * 4));
  const __m128i x5 = _mm_loadu_si128((__m128i *)(in0 + in_p * 5));
  const __m128i x6 = _mm_loadu_si128((__m128i *)(in0 + in_p * 6));
  const __m128i x7 = _mm_loadu_si128((__m128i *)(in0 + in_p * 7));

  const __m256i y0 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x0), _mm_loadu_si128((__m128i *)(in0 + in_p * 8)),
      0x1);
  const __m256i y1 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x1), _mm_loadu_si128((__m128i *)(in0 + in_p * 9)),
      0x1);
  const __m256i y2 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x2), _mm_loadu_si128((__m128i *)(in0 + in_p * 10)),
      0x1);
  const __m256i y3 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x3), _mm_loadu_si128((__m128i *)(in0 + in_p * 11)),
      0x1);
  const __m256i y4 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x4), _mm_loadu_si128((__m128i *)(in0 + in_p * 12)),
      0x1);
  const __m256i y5 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x5), _mm_loadu_si128((__m128i *)(in0 + in_p * 13)),
      0x1);
  const __m256i y6 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x6), _mm_loadu_si128((__m128i *)(in0 + in_p * 14)),
      0x1);
  const __m256i y7 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x7), _mm_loadu_si128((__m128i *)(in0 + in_p * 15)),
      0x1);

  const __m256i y_s00 = _mm256_unpacklo_epi8(y0, y1);
  const __m256i y_s01 = _mm256_unpackhi_epi8(y0, y1);
  const __m256i y_s02 = _mm256_unpacklo_epi8(y2, y3);
  const __m256i y_s03 = _mm256_unpackhi_epi8(y2, y3);
  const __m256i y_s04 = _mm256_unpacklo_epi8(y4, y5);
  const __m256i y_s05 = _mm256_unpackhi_epi8(y4, y5);
  const __m256i y_s06 = _mm256_unpacklo_epi8(y6, y7);
  const __m256i y_s07 = _mm256_unpackhi_epi8(y6, y7);

  const __m256i y_s10 = _mm256_unpacklo_epi16(y_s00, y_s02);
  const __m256i y_s11 = _mm256_unpackhi_epi16(y_s00, y_s02);
  const __m256i y_s12 = _mm256_unpacklo_epi16(y_s01, y_s03);
  const __m256i y_s13 = _mm256_unpackhi_epi16(y_s01, y_s03);
  const __m256i y_s14 = _mm256_unpacklo_epi16(y_s04, y_s06);
  const __m256i y_s15 = _mm256_unpackhi_epi16(y_s04, y_s06);
  const __m256i y_s16 = _mm256_unpacklo_epi16(y_s05, y_s07);
  const __m256i y_s17 = _mm256_unpackhi_epi16(y_s05, y_s07);

  const __m256i y_s20 = _mm256_unpacklo_epi32(y_s10, y_s14);
  const __m256i y_s21 = _mm256_unpackhi_epi32(y_s10, y_s14);
  const __m256i y_s22 = _mm256_unpacklo_epi32(y_s11, y_s15);
  const __m256i y_s23 = _mm256_unpackhi_epi32(y_s11, y_s15);
  const __m256i y_s24 = _mm256_unpacklo_epi32(y_s12, y_s16);
  const __m256i y_s25 = _mm256_unpackhi_epi32(y_s12, y_s16);
  const __m256i y_s26 = _mm256_unpacklo_epi32(y_s13, y_s17);
  const __m256i y_s27 = _mm256_unpackhi_epi32(y_s13, y_s17);

  const __m256i row_s01 = _mm256_permute4x64_epi64(y_s20, 0xd8);
  const __m256i row_s23 = _mm256_permute4x64_epi64(y_s21, 0xd8);
  const __m256i row_s45 = _mm256_permute4x64_epi64(y_s22, 0xd8);
  const __m256i row_s67 = _mm256_permute4x64_epi64(y_s23, 0xd8);
  const __m256i row_s89 = _mm256_permute4x64_epi64(y_s24, 0xd8);
  const __m256i row_s1011 = _mm256_permute4x64_epi64(y_s25, 0xd8);
  const __m256i row_s1213 = _mm256_permute4x64_epi64(y_s26, 0xd8);
  const __m256i row_s1415 = _mm256_permute4x64_epi64(y_s27, 0xd8);

  if (is_store_avx2) {
    _mm256_storeu_si256((__m256i *)(out), row_s01);
    _mm256_storeu_si256((__m256i *)(out + (2 * out_p)), row_s23);
    _mm256_storeu_si256((__m256i *)(out + (4 * out_p)), row_s45);
    _mm256_storeu_si256((__m256i *)(out + (6 * out_p)), row_s67);
    _mm256_storeu_si256((__m256i *)(out + (8 * out_p)), row_s89);
    _mm256_storeu_si256((__m256i *)(out + (10 * out_p)), row_s1011);
    _mm256_storeu_si256((__m256i *)(out + (12 * out_p)), row_s1213);
    _mm256_storeu_si256((__m256i *)(out + (14 * out_p)), row_s1415);
  } else {
    _mm_storeu_si128((__m128i *)(out), _mm256_castsi256_si128(row_s01));
    _mm_storeu_si128((__m128i *)(out + (2 * out_p)),
                     _mm256_castsi256_si128(row_s23));
    _mm_storeu_si128((__m128i *)(out + (4 * out_p)),
                     _mm256_castsi256_si128(row_s45));
    _mm_storeu_si128((__m128i *)(out + (6 * out_p)),
                     _mm256_castsi256_si128(row_s67));
    _mm_storeu_si128((__m128i *)(out + (8 * out_p)),
                     _mm256_castsi256_si128(row_s89));
    _mm_storeu_si128((__m128i *)(out + (10 * out_p)),
                     _mm256_castsi256_si128(row_s1011));
    _mm_storeu_si128((__m128i *)(out + (12 * out_p)),
                     _mm256_castsi256_si128(row_s1213));
    _mm_storeu_si128((__m128i *)(out + (14 * out_p)),
                     _mm256_castsi256_si128(row_s1415));
    _mm_storeu_si128((__m128i *)(out + (1 * out_p)),
                     _mm256_extracti128_si256(row_s01, 1));
    _mm_storeu_si128((__m128i *)(out + (3 * out_p)),
                     _mm256_extracti128_si256(row_s23, 1));
    _mm_storeu_si128((__m128i *)(out + (5 * out_p)),
                     _mm256_extracti128_si256(row_s45, 1));
    _mm_storeu_si128((__m128i *)(out + (7 * out_p)),
                     _mm256_extracti128_si256(row_s67, 1));
    _mm_storeu_si128((__m128i *)(out + (9 * out_p)),
                     _mm256_extracti128_si256(row_s89, 1));
    _mm_storeu_si128((__m128i *)(out + (11 * out_p)),
                     _mm256_extracti128_si256(row_s1011, 1));
    _mm_storeu_si128((__m128i *)(out + (13 * out_p)),
                     _mm256_extracti128_si256(row_s1213, 1));
    _mm_storeu_si128((__m128i *)(out + (15 * out_p)),
                     _mm256_extracti128_si256(row_s1415, 1));
  }
}